

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int xmlParseLookupGt(xmlParserCtxtPtr ctxt)

{
  byte *pbVar1;
  byte bVar2;
  long lVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  
  uVar4 = ctxt->endCheckState;
  lVar3 = ctxt->checkIndex + (ulong)(ctxt->checkIndex == 0);
  do {
    pbVar1 = ctxt->input->cur + lVar3;
    if (ctxt->input->end <= pbVar1) {
      lVar5 = 0;
      if (0 < lVar3) {
        lVar5 = lVar3;
      }
      if (lVar3 < 0) {
        uVar4 = 0;
      }
      uVar6 = (uint)((ulong)lVar3 >> 0x3f);
LAB_00141e9c:
      ctxt->checkIndex = lVar5;
      ctxt->endCheckState = uVar4;
      return uVar6;
    }
    bVar2 = *pbVar1;
    if (uVar4 == 0) {
      uVar6 = (uint)bVar2;
      uVar4 = uVar6;
      if (((uVar6 != 0x22) && (uVar6 != 0x27)) && (uVar4 = 0, uVar6 == 0x3e)) {
        uVar6 = 1;
        lVar5 = 0;
        uVar4 = 0;
        goto LAB_00141e9c;
      }
    }
    else if (uVar4 == bVar2) {
      uVar4 = 0;
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

static int
xmlParseLookupGt(xmlParserCtxtPtr ctxt) {
    const xmlChar *cur;
    const xmlChar *end = ctxt->input->end;
    int state = ctxt->endCheckState;
    size_t index;

    if (ctxt->checkIndex == 0)
        cur = ctxt->input->cur + 1;
    else
        cur = ctxt->input->cur + ctxt->checkIndex;

    while (cur < end) {
        if (state) {
            if (*cur == state)
                state = 0;
        } else if (*cur == '\'' || *cur == '"') {
            state = *cur;
        } else if (*cur == '>') {
            ctxt->checkIndex = 0;
            ctxt->endCheckState = 0;
            return(1);
        }
        cur++;
    }

    index = cur - ctxt->input->cur;
    if (index > LONG_MAX) {
        ctxt->checkIndex = 0;
        ctxt->endCheckState = 0;
        return(1);
    }
    ctxt->checkIndex = index;
    ctxt->endCheckState = state;
    return(0);
}